

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateEndStructMethod
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  string name;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  _Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_78;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"end",(allocator<char> *)local_60._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"",(allocator<char> *)&local_78);
  IdlNamer::LegacyJavaMethod2(&local_40,&this->namer_,&local_98,struct_def,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&local_78,
             &(struct_def->fields).vec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"builder: FlatBufferBuilder",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Int",&local_ba);
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:677:9)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:677:9)>
             ::_M_manager;
  local_60._M_unused._M_object = writer;
  local_60._8_8_ = &local_78;
  GenerateFun(writer,&local_40,&local_98,&local_b8,(function<void_()> *)&local_60,
              options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void GenerateEndStructMethod(StructDef &struct_def, CodeWriter &writer,
                               const IDLOptions options) const {
    // Generate end{{TableName}}(builder: FlatBufferBuilder) method
    auto name = namer_.LegacyJavaMethod2("end", struct_def, "");
    auto params = "builder: FlatBufferBuilder";
    auto returns = "Int";
    auto field_vec = struct_def.fields.vec;

    GenerateFun(
        writer, name, params, returns,
        [&]() {
          writer += "val o = builder.endTable()";
          writer.IncrementIdentLevel();
          for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
            auto &field = **it;
            if (field.deprecated || !field.IsRequired()) { continue; }
            writer.SetValue("offset", NumToString(field.value.offset));
            writer += "builder.required(o, {{offset}})";
          }
          writer.DecrementIdentLevel();
          writer += "return o";
        },
        options.gen_jvmstatic);
  }